

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * fmt::v5::internal::
       parse_arg_id<char,fmt::v5::internal::width_adapter<fmt::v5::formatter<std::chrono::duration<int,std::ratio<1000l,1l>>,char,void>::spec_handler&,char>>
                 (char *begin,char *end,
                 width_adapter<fmt::v5::formatter<std::chrono::duration<int,_std::ratio<1000L,_1L>_>,_char,_void>::spec_handler_&,_char>
                 *handler)

{
  byte bVar1;
  formatter<std::chrono::duration<int,_std::ratio<1000L,_1L>_>,_char,_void> *pfVar2;
  uint id;
  byte *pbVar3;
  byte *pbVar4;
  byte *local_20;
  
  bVar1 = *begin;
  local_20 = (byte *)begin;
  if ((bVar1 == 0x7d) || (bVar1 == 0x3a)) {
    width_adapter<fmt::v5::formatter<std::chrono::duration<int,_std::ratio<1000L,_1L>_>,_char,_void>::spec_handler_&,_char>
    ::operator()(handler);
    local_20 = (byte *)begin;
  }
  else if ((byte)(bVar1 - 0x30) < 10) {
    id = parse_nonnegative_int<char,fmt::v5::internal::width_adapter<fmt::v5::formatter<std::chrono::duration<int,std::ratio<1000l,1l>>,char,void>::spec_handler&,char>&>
                   ((char **)&local_20,end,handler);
    if ((local_20 == (byte *)end) || ((*local_20 != 0x3a && (*local_20 != 0x7d)))) {
      width_adapter<fmt::v5::formatter<std::chrono::duration<int,_std::ratio<1000L,_1L>_>,_char,_void>::spec_handler_&,_char>
      ::on_error(handler,"invalid format string");
    }
    else {
      width_adapter<fmt::v5::formatter<std::chrono::duration<int,_std::ratio<1000L,_1L>_>,_char,_void>::spec_handler_&,_char>
      ::operator()(handler,id);
    }
  }
  else if ((bVar1 == 0x5f) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) {
    pbVar4 = (byte *)(begin + 1);
    do {
      pbVar3 = pbVar4;
      local_20 = (byte *)end;
      if (pbVar3 == (byte *)end) break;
      bVar1 = *pbVar3;
      pbVar4 = pbVar3 + 1;
    } while ((((byte)(bVar1 - 0x30) < 10) || (bVar1 == 0x5f)) ||
            (local_20 = pbVar3, (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
    pfVar2 = handler->handler->f;
    (pfVar2->width_ref).kind = NAME;
    (pfVar2->width_ref).field_1.name.value = begin;
    (pfVar2->width_ref).field_1.name.size = (long)local_20 - (long)begin;
  }
  else {
    width_adapter<fmt::v5::formatter<std::chrono::duration<int,_std::ratio<1000L,_1L>_>,_char,_void>::spec_handler_&,_char>
    ::on_error(handler,"invalid format string");
    local_20 = (byte *)begin;
  }
  return (char *)local_20;
}

Assistant:

FMT_CONSTEXPR const Char *parse_arg_id(
    const Char *begin, const Char *end, IDHandler &&handler) {
  assert(begin != end);
  Char c = *begin;
  if (c == '}' || c == ':')
    return handler(), begin;
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(begin, end, handler);
    if (begin == end || (*begin != '}' && *begin != ':'))
      return handler.on_error("invalid format string"), begin;
    handler(index);
    return begin;
  }
  if (!is_name_start(c))
    return handler.on_error("invalid format string"), begin;
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}